

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_invoke_helpers.hpp
# Opt level: O0

void asio_handler_invoke_helpers::
     invoke<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,asio::ssl::detail::handshake_op,SL::WS_LITE::async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::__0>>,std::error_code,unsigned_long>,asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,asio::ssl::detail::handshake_op,SL::WS_LITE::async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::__0>>>
               (binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>_>,_std::error_code,_unsigned_long>
                *function,
               write_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>_>
               *context)

{
  write_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>_>
  *context_local;
  binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>_>,_std::error_code,_unsigned_long>
  *function_local;
  
  asio::detail::
  asio_handler_invoke<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,asio::ssl::detail::handshake_op,SL::WS_LITE::async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::__0>>,std::error_code,unsigned_long>,asio::basic_stream_socket<asio::ip::tcp>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,asio::ssl::detail::handshake_op,SL::WS_LITE::async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::__0>>
            (function,context);
  return;
}

Assistant:

inline void invoke(Function& function, Context& context)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  Function tmp(function);
  tmp();
#else
  using asio::asio_handler_invoke;
  asio_handler_invoke(function, asio::detail::addressof(context));
#endif
}